

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

Sample * __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderCountCase::renderSample
          (Sample *__return_storage_ptr__,RenderCountCase *this,RenderData *occluder,
          RenderData *occluded,int callcount)

{
  int iVar1;
  undefined4 extraout_var;
  deUint64 dVar3;
  undefined1 local_44 [4];
  deUint64 dStack_40;
  deUint8 buffer [4];
  deUint64 prev;
  deUint64 now;
  Functions *gl;
  int callcount_local;
  RenderData *occluded_local;
  RenderData *occluder_local;
  RenderCountCase *this_local;
  long lVar2;
  
  iVar1 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  dStack_40 = 0;
  (**(code **)(lVar2 + 0x188))(0x4500);
  (**(code **)(lVar2 + 0x5e0))(0xb71);
  (**(code **)(lVar2 + 0x1220))(0,0,1,1,0x1908,0x1401,local_44);
  dStack_40 = deGetMicroseconds();
  (**(code **)(lVar2 + 0x188))(0x4500);
  (**(code **)(lVar2 + 0x5e0))(0xb71);
  BaseCase::render(&this->super_BaseCase,occluder);
  BaseCase::render(&this->super_BaseCase,occluded,callcount);
  (**(code **)(lVar2 + 0x1220))(0,0,1,1,0x1908,0x1401,local_44);
  dVar3 = deGetMicroseconds();
  __return_storage_ptr__->testTime = dVar3 - dStack_40;
  __return_storage_ptr__->baseTime = 0;
  __return_storage_ptr__->nullTime = 0;
  __return_storage_ptr__->workload = callcount;
  return __return_storage_ptr__;
}

Assistant:

Sample RenderCountCase::renderSample (const RenderData& occluder, const RenderData& occluded, int callcount) const
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	Sample					sample;
	deUint64				now		= 0;
	deUint64				prev	= 0;
	deUint8					buffer[4];

	// Stabilize
	{
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
		gl.enable(GL_DEPTH_TEST);
		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
	}

	prev = deGetMicroseconds();

	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	render(occluder);
	render(occluded, callcount);

	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

	now = deGetMicroseconds();

	sample.testTime = now - prev;
	sample.baseTime = 0;
	sample.nullTime = 0;
	sample.workload = callcount;

	return sample;
}